

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void read_input(Direction *direction_1,Direction *direction_2,bool *END_GAME)

{
  char local_5f;
  char local_5e;
  char local_5d;
  undefined1 local_5c [5];
  char input_char3;
  char input_char2;
  char input_char1;
  termios t;
  bool *END_GAME_local;
  Direction *direction_2_local;
  Direction *direction_1_local;
  
  t._52_8_ = END_GAME;
  while (((*(byte *)t._52_8_ ^ 0xff) & 1) != 0) {
    tcgetattr(0,(termios *)local_5c);
    t.c_oflag = t.c_oflag & 0xfffffffd;
    tcsetattr(0,0,(termios *)local_5c);
    std::operator>>((istream *)&std::cin,&local_5d);
    if ((((local_5d == 'w') || (local_5d == 's')) || (local_5d == 'd')) || (local_5d == 'a')) {
      change_direction_move(direction_2,local_5d);
    }
    if (local_5d == '\x1b') {
      std::operator>>((istream *)&std::cin,&local_5e);
      std::operator>>((istream *)&std::cin,&local_5f);
      if (local_5e == '[') {
        change_direction_move(direction_1,local_5f);
      }
    }
  }
  return;
}

Assistant:

void read_input(Direction& direction_1, Direction& direction_2, bool& END_GAME)
{
    while(!END_GAME)
    {
        // Black magic to prevent Linux from buffering keystrokes.
        struct termios t;
        tcgetattr(STDIN_FILENO, &t);
        t.c_lflag &= ~ICANON;
        tcsetattr(STDIN_FILENO, TCSANOW, &t);

        char input_char1, input_char2, input_char3;
        cin >> input_char1;

        // PLAYER 2
        if(input_char1 == 'w' or input_char1 == 's' or input_char1 == 'd' or input_char1 == 'a')
            change_direction_move(direction_2, input_char1);

        // PLAYER 1
        if(input_char1 == 27)
        {
            cin >> input_char2;
            cin >> input_char3;
            if (input_char2 == 91)
                change_direction_move(direction_1, input_char3);
        }
    }
}